

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16781328,_true,_embree::avx2::VirtualCurveIntersectorK<8>,_true>::
     intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
               RayHitK<8> *ray,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  uint uVar8;
  StackItemT<embree::NodeRefPtr<4>_> SVar9;
  StackItemT<embree::NodeRefPtr<4>_> SVar10;
  StackItemT<embree::NodeRefPtr<4>_> SVar11;
  undefined1 auVar12 [16];
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  float fVar17;
  long lVar18;
  ulong uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar23;
  int iVar24;
  AABBNodeMB4D *node1;
  ulong uVar25;
  uint uVar26;
  ulong uVar27;
  undefined4 uVar28;
  ulong unaff_RBP;
  undefined4 uVar29;
  ulong uVar30;
  size_t sVar31;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar32;
  ulong uVar33;
  ulong uVar34;
  undefined1 auVar35 [64];
  vint4 bi;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  vint4 ai_1;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  vint4 bi_1;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  vint4 ai_3;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  vint4 bi_3;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  vint4 ai;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  pSVar32 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar66._4_4_ = uVar1;
  auVar66._0_4_ = uVar1;
  auVar66._8_4_ = uVar1;
  auVar66._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar67._4_4_ = uVar1;
  auVar67._0_4_ = uVar1;
  auVar67._8_4_ = uVar1;
  auVar67._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  auVar64._4_4_ = uVar1;
  auVar64._0_4_ = uVar1;
  auVar64._8_4_ = uVar1;
  auVar64._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4);
  uVar2 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fVar3 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x40);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar5 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar6 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  fVar13 = fVar4 * 0.99999964;
  fVar14 = fVar5 * 0.99999964;
  fVar15 = fVar6 * 0.99999964;
  fVar4 = fVar4 * 1.0000004;
  fVar5 = fVar5 * 1.0000004;
  fVar6 = fVar6 * 1.0000004;
  uVar33 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar27 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar34 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  iVar24 = (tray->tnear).field_0.i[k];
  auVar62._4_4_ = iVar24;
  auVar62._0_4_ = iVar24;
  auVar62._8_4_ = iVar24;
  auVar62._12_4_ = iVar24;
  iVar24 = (tray->tfar).field_0.i[k];
  auVar35 = ZEXT1664(CONCAT412(iVar24,CONCAT48(iVar24,CONCAT44(iVar24,iVar24))));
  while (pSVar32 != stack) {
    pSVar23 = pSVar32 + -1;
    pSVar32 = pSVar32 + -1;
    if ((float)pSVar23->dist <= *(float *)(ray + k * 4 + 0x100)) {
      sVar31 = (pSVar32->ptr).ptr;
      do {
        if ((sVar31 & 8) == 0) {
          fVar7 = *(float *)(ray + k * 4 + 0xe0);
          uVar26 = (uint)sVar31 & 7;
          uVar25 = sVar31 & 0xfffffffffffffff0;
          uVar29 = (undefined4)(unaff_RBP >> 0x20);
          if (uVar26 == 3) {
            auVar37 = *(undefined1 (*) [16])(uVar25 + 0x80);
            auVar12 = *(undefined1 (*) [16])(uVar25 + 0x90);
            fVar17 = 1.0 - fVar7;
            auVar38._4_4_ = fVar17;
            auVar38._0_4_ = fVar17;
            auVar38._8_4_ = fVar17;
            auVar38._12_4_ = fVar17;
            auVar65._0_4_ = fVar7 * *(float *)(uVar25 + 0xe0);
            auVar65._4_4_ = fVar7 * *(float *)(uVar25 + 0xe4);
            auVar65._8_4_ = fVar7 * *(float *)(uVar25 + 0xe8);
            auVar65._12_4_ = fVar7 * *(float *)(uVar25 + 0xec);
            auVar44._0_4_ = fVar7 * *(float *)(uVar25 + 0xf0);
            auVar44._4_4_ = fVar7 * *(float *)(uVar25 + 0xf4);
            auVar44._8_4_ = fVar7 * *(float *)(uVar25 + 0xf8);
            auVar44._12_4_ = fVar7 * *(float *)(uVar25 + 0xfc);
            auVar59._0_4_ = fVar7 * *(float *)(uVar25 + 0x100);
            auVar59._4_4_ = fVar7 * *(float *)(uVar25 + 0x104);
            auVar59._8_4_ = fVar7 * *(float *)(uVar25 + 0x108);
            auVar59._12_4_ = fVar7 * *(float *)(uVar25 + 0x10c);
            auVar39 = ZEXT816(0) << 0x40;
            auVar21 = vfmadd231ps_fma(auVar65,auVar38,auVar39);
            auVar41 = vfmadd231ps_fma(auVar44,auVar38,auVar39);
            auVar46 = vfmadd231ps_fma(auVar59,auVar38,auVar39);
            auVar39._0_4_ = fVar3 * auVar37._0_4_;
            auVar39._4_4_ = fVar3 * auVar37._4_4_;
            auVar39._8_4_ = fVar3 * auVar37._8_4_;
            auVar39._12_4_ = fVar3 * auVar37._12_4_;
            auVar56._0_4_ = fVar3 * auVar12._0_4_;
            auVar56._4_4_ = fVar3 * auVar12._4_4_;
            auVar56._8_4_ = fVar3 * auVar12._8_4_;
            auVar56._12_4_ = fVar3 * auVar12._12_4_;
            auVar22._4_4_ = uVar2;
            auVar22._0_4_ = uVar2;
            auVar22._8_4_ = uVar2;
            auVar22._12_4_ = uVar2;
            auVar38 = vfmadd231ps_fma(auVar39,auVar22,*(undefined1 (*) [16])(uVar25 + 0x50));
            auVar39 = vfmadd231ps_fma(auVar56,auVar22,*(undefined1 (*) [16])(uVar25 + 0x60));
            auVar20._4_4_ = uVar1;
            auVar20._0_4_ = uVar1;
            auVar20._8_4_ = uVar1;
            auVar20._12_4_ = uVar1;
            auVar16 = vfmadd231ps_fma(auVar38,auVar20,*(undefined1 (*) [16])(uVar25 + 0x20));
            auVar39 = vfmadd231ps_fma(auVar39,auVar20,*(undefined1 (*) [16])(uVar25 + 0x30));
            auVar45._8_4_ = 0x7fffffff;
            auVar45._0_8_ = 0x7fffffff7fffffff;
            auVar45._12_4_ = 0x7fffffff;
            auVar38 = vandps_avx(auVar16,auVar45);
            auVar50._8_4_ = 0x219392ef;
            auVar50._0_8_ = 0x219392ef219392ef;
            auVar50._12_4_ = 0x219392ef;
            auVar38 = vcmpps_avx(auVar38,auVar50,1);
            auVar16 = vblendvps_avx(auVar16,auVar50,auVar38);
            auVar38 = vandps_avx(auVar39,auVar45);
            auVar38 = vcmpps_avx(auVar38,auVar50,1);
            auVar44 = vblendvps_avx(auVar39,auVar50,auVar38);
            auVar38 = *(undefined1 (*) [16])(uVar25 + 0xa0);
            auVar40._0_4_ = fVar3 * auVar38._0_4_;
            auVar40._4_4_ = fVar3 * auVar38._4_4_;
            auVar40._8_4_ = fVar3 * auVar38._8_4_;
            auVar40._12_4_ = fVar3 * auVar38._12_4_;
            auVar39 = vfmadd231ps_fma(auVar40,auVar22,*(undefined1 (*) [16])(uVar25 + 0x70));
            auVar22 = vfmadd231ps_fma(auVar39,auVar20,*(undefined1 (*) [16])(uVar25 + 0x40));
            auVar39 = vandps_avx(auVar22,auVar45);
            auVar39 = vcmpps_avx(auVar39,auVar50,1);
            auVar39 = vblendvps_avx(auVar22,auVar50,auVar39);
            auVar22 = vrcpps_avx(auVar16);
            auVar51._8_4_ = 0x3f800000;
            auVar51._0_8_ = &DAT_3f8000003f800000;
            auVar51._12_4_ = 0x3f800000;
            auVar16 = vfnmadd213ps_fma(auVar16,auVar22,auVar51);
            auVar22 = vfmadd132ps_fma(auVar16,auVar22,auVar22);
            auVar16 = vrcpps_avx(auVar44);
            auVar44 = vfnmadd213ps_fma(auVar44,auVar16,auVar51);
            auVar20 = vfmadd132ps_fma(auVar44,auVar16,auVar16);
            auVar16 = vrcpps_avx(auVar39);
            auVar39 = vfnmadd213ps_fma(auVar39,auVar16,auVar51);
            auVar37 = vfmadd213ps_fma(auVar37,auVar64,*(undefined1 (*) [16])(uVar25 + 0xb0));
            auVar40 = vfmadd132ps_fma(auVar39,auVar16,auVar16);
            auVar39 = vfmadd231ps_fma(auVar37,*(undefined1 (*) [16])(uVar25 + 0x50),auVar67);
            auVar37 = vfmadd213ps_fma(auVar12,auVar64,*(undefined1 (*) [16])(uVar25 + 0xc0));
            auVar12 = vfmadd231ps_fma(auVar37,*(undefined1 (*) [16])(uVar25 + 0x60),auVar67);
            auVar37 = vfmadd213ps_fma(auVar38,auVar64,*(undefined1 (*) [16])(uVar25 + 0xd0));
            auVar37 = vfmadd231ps_fma(auVar37,auVar67,*(undefined1 (*) [16])(uVar25 + 0x70));
            auVar38 = vfmadd231ps_fma(auVar39,auVar66,*(undefined1 (*) [16])(uVar25 + 0x20));
            auVar39 = vfmadd231ps_fma(auVar12,auVar66,*(undefined1 (*) [16])(uVar25 + 0x30));
            auVar44 = vfmadd231ps_fma(auVar37,auVar66,*(undefined1 (*) [16])(uVar25 + 0x40));
            auVar37 = vsubps_avx(auVar21,auVar38);
            auVar12._4_4_ = fVar17 + fVar7 * *(float *)(uVar25 + 0x114);
            auVar12._0_4_ = fVar17 + fVar7 * *(float *)(uVar25 + 0x110);
            auVar12._8_4_ = fVar17 + fVar7 * *(float *)(uVar25 + 0x118);
            auVar12._12_4_ = fVar17 + fVar7 * *(float *)(uVar25 + 0x11c);
            auVar12 = vsubps_avx(auVar12,auVar38);
            auVar38 = vsubps_avx(auVar41,auVar39);
            auVar16._4_4_ = fVar7 * *(float *)(uVar25 + 0x124) + fVar17;
            auVar16._0_4_ = fVar7 * *(float *)(uVar25 + 0x120) + fVar17;
            auVar16._8_4_ = fVar7 * *(float *)(uVar25 + 0x128) + fVar17;
            auVar16._12_4_ = fVar7 * *(float *)(uVar25 + 300) + fVar17;
            auVar39 = vsubps_avx(auVar16,auVar39);
            auVar16 = vsubps_avx(auVar46,auVar44);
            auVar21._4_4_ = fVar17 + fVar7 * *(float *)(uVar25 + 0x134);
            auVar21._0_4_ = fVar17 + fVar7 * *(float *)(uVar25 + 0x130);
            auVar21._8_4_ = fVar17 + fVar7 * *(float *)(uVar25 + 0x138);
            auVar21._12_4_ = fVar17 + fVar7 * *(float *)(uVar25 + 0x13c);
            auVar44 = vsubps_avx(auVar21,auVar44);
            auVar46._0_4_ = auVar22._0_4_ * auVar37._0_4_;
            auVar46._4_4_ = auVar22._4_4_ * auVar37._4_4_;
            auVar46._8_4_ = auVar22._8_4_ * auVar37._8_4_;
            auVar46._12_4_ = auVar22._12_4_ * auVar37._12_4_;
            auVar52._0_4_ = auVar22._0_4_ * auVar12._0_4_;
            auVar52._4_4_ = auVar22._4_4_ * auVar12._4_4_;
            auVar52._8_4_ = auVar22._8_4_ * auVar12._8_4_;
            auVar52._12_4_ = auVar22._12_4_ * auVar12._12_4_;
            auVar57._0_4_ = auVar20._0_4_ * auVar38._0_4_;
            auVar57._4_4_ = auVar20._4_4_ * auVar38._4_4_;
            auVar57._8_4_ = auVar20._8_4_ * auVar38._8_4_;
            auVar57._12_4_ = auVar20._12_4_ * auVar38._12_4_;
            auVar63._0_4_ = auVar16._0_4_ * auVar40._0_4_;
            auVar63._4_4_ = auVar16._4_4_ * auVar40._4_4_;
            auVar63._8_4_ = auVar16._8_4_ * auVar40._8_4_;
            auVar63._12_4_ = auVar16._12_4_ * auVar40._12_4_;
            auVar60._0_4_ = auVar20._0_4_ * auVar39._0_4_;
            auVar60._4_4_ = auVar20._4_4_ * auVar39._4_4_;
            auVar60._8_4_ = auVar20._8_4_ * auVar39._8_4_;
            auVar60._12_4_ = auVar20._12_4_ * auVar39._12_4_;
            auVar41._0_4_ = auVar44._0_4_ * auVar40._0_4_;
            auVar41._4_4_ = auVar44._4_4_ * auVar40._4_4_;
            auVar41._8_4_ = auVar44._8_4_ * auVar40._8_4_;
            auVar41._12_4_ = auVar44._12_4_ * auVar40._12_4_;
            auVar37 = vpminsd_avx(auVar57,auVar60);
            auVar12 = vpminsd_avx(auVar63,auVar41);
            auVar37 = vmaxps_avx(auVar37,auVar12);
            auVar16 = vpminsd_avx(auVar46,auVar52);
            auVar39 = vpmaxsd_avx(auVar46,auVar52);
            auVar12 = vpmaxsd_avx(auVar57,auVar60);
            auVar38 = vpmaxsd_avx(auVar63,auVar41);
            auVar38 = vminps_avx(auVar12,auVar38);
            auVar12 = vmaxps_avx(auVar62,auVar16);
            auVar37 = vmaxps_avx(auVar12,auVar37);
            auVar12 = vminps_avx(auVar35._0_16_,auVar39);
            auVar12 = vminps_avx(auVar12,auVar38);
            tNear.field_0._0_4_ = auVar37._0_4_ * 0.99999964;
            tNear.field_0._4_4_ = auVar37._4_4_ * 0.99999964;
            tNear.field_0._8_4_ = auVar37._8_4_ * 0.99999964;
            tNear.field_0._12_4_ = auVar37._12_4_ * 0.99999964;
            auVar37._0_4_ = auVar12._0_4_ * 1.0000004;
            auVar37._4_4_ = auVar12._4_4_ * 1.0000004;
            auVar37._8_4_ = auVar12._8_4_ * 1.0000004;
            auVar37._12_4_ = auVar12._12_4_ * 1.0000004;
            auVar37 = vcmpps_avx((undefined1  [16])tNear.field_0,auVar37,2);
            uVar28 = vmovmskps_avx(auVar37);
            unaff_RBP = CONCAT44(uVar29,uVar28);
          }
          else {
            auVar36._4_4_ = fVar7;
            auVar36._0_4_ = fVar7;
            auVar36._8_4_ = fVar7;
            auVar36._12_4_ = fVar7;
            auVar37 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar25 + 0x80 + uVar33),auVar36,
                                      *(undefined1 (*) [16])(uVar25 + 0x20 + uVar33));
            auVar37 = vsubps_avx(auVar37,auVar66);
            auVar43._0_4_ = fVar13 * auVar37._0_4_;
            auVar43._4_4_ = fVar13 * auVar37._4_4_;
            auVar43._8_4_ = fVar13 * auVar37._8_4_;
            auVar43._12_4_ = fVar13 * auVar37._12_4_;
            auVar37 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar25 + 0x80 + uVar27),auVar36,
                                      *(undefined1 (*) [16])(uVar25 + 0x20 + uVar27));
            auVar37 = vsubps_avx(auVar37,auVar67);
            auVar48._0_4_ = fVar14 * auVar37._0_4_;
            auVar48._4_4_ = fVar14 * auVar37._4_4_;
            auVar48._8_4_ = fVar14 * auVar37._8_4_;
            auVar48._12_4_ = fVar14 * auVar37._12_4_;
            auVar37 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar25 + 0x80 + uVar34),auVar36,
                                      *(undefined1 (*) [16])(uVar25 + 0x20 + uVar34));
            auVar37 = vsubps_avx(auVar37,auVar64);
            auVar54._0_4_ = fVar15 * auVar37._0_4_;
            auVar54._4_4_ = fVar15 * auVar37._4_4_;
            auVar54._8_4_ = fVar15 * auVar37._8_4_;
            auVar54._12_4_ = fVar15 * auVar37._12_4_;
            auVar37 = vmaxps_avx(auVar48,auVar54);
            auVar12 = vmaxps_avx(auVar62,auVar43);
            tNear.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vmaxps_avx(auVar12,auVar37);
            auVar37 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar25 + 0x80 + (uVar33 ^ 0x10)),
                                      auVar36,*(undefined1 (*) [16])
                                               (uVar25 + 0x20 + (uVar33 ^ 0x10)));
            auVar37 = vsubps_avx(auVar37,auVar66);
            auVar12 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar25 + 0x80 + (uVar27 ^ 0x10)),
                                      auVar36,*(undefined1 (*) [16])
                                               (uVar25 + 0x20 + (uVar27 ^ 0x10)));
            auVar49._0_4_ = fVar4 * auVar37._0_4_;
            auVar49._4_4_ = fVar4 * auVar37._4_4_;
            auVar49._8_4_ = fVar4 * auVar37._8_4_;
            auVar49._12_4_ = fVar4 * auVar37._12_4_;
            auVar37 = vsubps_avx(auVar12,auVar67);
            auVar55._0_4_ = fVar5 * auVar37._0_4_;
            auVar55._4_4_ = fVar5 * auVar37._4_4_;
            auVar55._8_4_ = fVar5 * auVar37._8_4_;
            auVar55._12_4_ = fVar5 * auVar37._12_4_;
            auVar37 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar25 + 0x80 + (uVar34 ^ 0x10)),
                                      auVar36,*(undefined1 (*) [16])
                                               (uVar25 + 0x20 + (uVar34 ^ 0x10)));
            auVar37 = vsubps_avx(auVar37,auVar64);
            auVar58._0_4_ = fVar6 * auVar37._0_4_;
            auVar58._4_4_ = fVar6 * auVar37._4_4_;
            auVar58._8_4_ = fVar6 * auVar37._8_4_;
            auVar58._12_4_ = fVar6 * auVar37._12_4_;
            auVar37 = vminps_avx(auVar55,auVar58);
            auVar12 = vminps_avx(auVar35._0_16_,auVar49);
            auVar37 = vminps_avx(auVar12,auVar37);
            if (uVar26 == 6) {
              auVar12 = vcmpps_avx((undefined1  [16])tNear.field_0,auVar37,2);
              auVar37 = vcmpps_avx(*(undefined1 (*) [16])(uVar25 + 0xe0),auVar36,2);
              auVar38 = vcmpps_avx(auVar36,*(undefined1 (*) [16])(uVar25 + 0xf0),1);
              auVar37 = vandps_avx(auVar37,auVar38);
              auVar37 = vandps_avx(auVar37,auVar12);
            }
            else {
              auVar37 = vcmpps_avx((undefined1  [16])tNear.field_0,auVar37,2);
            }
            auVar37 = vpslld_avx(auVar37,0x1f);
            uVar28 = vmovmskps_avx(auVar37);
            unaff_RBP = CONCAT44(uVar29,uVar28);
          }
        }
        if ((sVar31 & 8) == 0) {
          if (unaff_RBP == 0) {
            iVar24 = 4;
          }
          else {
            uVar30 = sVar31 & 0xfffffffffffffff0;
            lVar18 = 0;
            for (uVar25 = unaff_RBP; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
              lVar18 = lVar18 + 1;
            }
            iVar24 = 0;
            uVar25 = unaff_RBP - 1 & unaff_RBP;
            sVar31 = *(ulong *)(uVar30 + lVar18 * 8);
            if (uVar25 != 0) {
              uVar26 = tNear.field_0.i[lVar18];
              lVar18 = 0;
              for (uVar19 = uVar25; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
                lVar18 = lVar18 + 1;
              }
              uVar25 = uVar25 - 1 & uVar25;
              uVar19 = *(ulong *)(uVar30 + lVar18 * 8);
              uVar8 = tNear.field_0.i[lVar18];
              if (uVar25 == 0) {
                if (uVar26 < uVar8) {
                  (pSVar32->ptr).ptr = uVar19;
                  pSVar32->dist = uVar8;
                  pSVar32 = pSVar32 + 1;
                }
                else {
                  (pSVar32->ptr).ptr = sVar31;
                  pSVar32->dist = uVar26;
                  sVar31 = uVar19;
                  pSVar32 = pSVar32 + 1;
                }
              }
              else {
                auVar42._8_8_ = 0;
                auVar42._0_8_ = sVar31;
                auVar37 = vpunpcklqdq_avx(auVar42,ZEXT416(uVar26));
                auVar47._8_8_ = 0;
                auVar47._0_8_ = uVar19;
                auVar12 = vpunpcklqdq_avx(auVar47,ZEXT416(uVar8));
                lVar18 = 0;
                for (uVar19 = uVar25; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000)
                {
                  lVar18 = lVar18 + 1;
                }
                uVar25 = uVar25 - 1 & uVar25;
                auVar53._8_8_ = 0;
                auVar53._0_8_ = *(ulong *)(uVar30 + lVar18 * 8);
                auVar39 = vpunpcklqdq_avx(auVar53,ZEXT416((uint)tNear.field_0.i[lVar18]));
                auVar38 = vpcmpgtd_avx(auVar12,auVar37);
                if (uVar25 == 0) {
                  auVar16 = vpshufd_avx(auVar38,0xaa);
                  auVar38 = vblendvps_avx(auVar12,auVar37,auVar16);
                  auVar37 = vblendvps_avx(auVar37,auVar12,auVar16);
                  auVar12 = vpcmpgtd_avx(auVar39,auVar38);
                  auVar16 = vpshufd_avx(auVar12,0xaa);
                  auVar12 = vblendvps_avx(auVar39,auVar38,auVar16);
                  auVar38 = vblendvps_avx(auVar38,auVar39,auVar16);
                  auVar39 = vpcmpgtd_avx(auVar38,auVar37);
                  auVar39 = vpshufd_avx(auVar39,0xaa);
                  SVar9 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar38,auVar37,auVar39)
                  ;
                  SVar10 = (StackItemT<embree::NodeRefPtr<4>_>)
                           vblendvps_avx(auVar37,auVar38,auVar39);
                  *pSVar32 = SVar10;
                  pSVar32[1] = SVar9;
                  sVar31 = auVar12._0_8_;
                  pSVar32 = pSVar32 + 2;
                }
                else {
                  lVar18 = 0;
                  for (; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
                    lVar18 = lVar18 + 1;
                  }
                  auVar61._8_8_ = 0;
                  auVar61._0_8_ = *(ulong *)(uVar30 + lVar18 * 8);
                  auVar44 = vpunpcklqdq_avx(auVar61,ZEXT416((uint)tNear.field_0.i[lVar18]));
                  auVar16 = vpshufd_avx(auVar38,0xaa);
                  auVar38 = vblendvps_avx(auVar12,auVar37,auVar16);
                  auVar37 = vblendvps_avx(auVar37,auVar12,auVar16);
                  auVar12 = vpcmpgtd_avx(auVar44,auVar39);
                  auVar16 = vpshufd_avx(auVar12,0xaa);
                  auVar12 = vblendvps_avx(auVar44,auVar39,auVar16);
                  auVar39 = vblendvps_avx(auVar39,auVar44,auVar16);
                  auVar16 = vpcmpgtd_avx(auVar39,auVar37);
                  auVar44 = vpshufd_avx(auVar16,0xaa);
                  auVar16 = vblendvps_avx(auVar39,auVar37,auVar44);
                  SVar9 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar37,auVar39,auVar44)
                  ;
                  auVar37 = vpcmpgtd_avx(auVar12,auVar38);
                  auVar39 = vpshufd_avx(auVar37,0xaa);
                  auVar37 = vblendvps_avx(auVar12,auVar38,auVar39);
                  auVar12 = vblendvps_avx(auVar38,auVar12,auVar39);
                  auVar38 = vpcmpgtd_avx(auVar16,auVar12);
                  auVar38 = vpshufd_avx(auVar38,0xaa);
                  SVar10 = (StackItemT<embree::NodeRefPtr<4>_>)
                           vblendvps_avx(auVar16,auVar12,auVar38);
                  SVar11 = (StackItemT<embree::NodeRefPtr<4>_>)
                           vblendvps_avx(auVar12,auVar16,auVar38);
                  *pSVar32 = SVar9;
                  pSVar32[1] = SVar11;
                  pSVar32[2] = SVar10;
                  sVar31 = auVar37._0_8_;
                  pSVar32 = pSVar32 + 3;
                }
              }
            }
          }
        }
        else {
          iVar24 = 6;
        }
      } while (iVar24 == 0);
      if (iVar24 == 6) {
        (**(code **)((long)This->leafIntersector +
                    (ulong)*(byte *)(sVar31 & 0xfffffffffffffff0) * 0x40 + 0x20))(pre,ray,k,context)
        ;
        uVar29 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar35 = ZEXT1664(CONCAT412(uVar29,CONCAT48(uVar29,CONCAT44(uVar29,uVar29))));
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }